

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O0

JoinRelationSet * __thiscall
duckdb::JoinRelationSetManager::GetJoinRelation(JoinRelationSetManager *this,idx_t index)

{
  type puVar1;
  JoinRelationSet *pJVar2;
  unsigned_long in_RSI;
  idx_t count;
  idx_t in_stack_00000040;
  unsafe_unique_array<idx_t> *in_stack_00000048;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> relations;
  size_t in_stack_ffffffffffffff98;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb8;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> local_38;
  undefined8 local_30;
  unsigned_long local_10;
  
  local_10 = in_RSI;
  make_unsafe_uniq_array<unsigned_long>(in_stack_ffffffffffffffb8);
  puVar1 = unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::operator[]
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *puVar1 = local_10;
  local_30 = 1;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::unique_ptr
            (in_stack_ffffffffffffffa0,&local_38);
  pJVar2 = GetJoinRelation((JoinRelationSetManager *)
                           relations.
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
                           in_stack_00000048,in_stack_00000040);
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *)0x1984058);
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *)0x1984062);
  return pJVar2;
}

Assistant:

JoinRelationSet &JoinRelationSetManager::GetJoinRelation(idx_t index) {
	// create a sorted vector of the relations
	auto relations = make_unsafe_uniq_array<idx_t>(1);
	relations[0] = index;
	idx_t count = 1;
	return GetJoinRelation(std::move(relations), count);
}